

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O0

void job_fin(job_t *job)

{
  char *local_70;
  char *local_60;
  char *local_50;
  char *local_40;
  ulong local_30;
  size_t _ut_i_3;
  size_t _ut_i_2;
  size_t _ut_i_1;
  size_t _ut_i;
  job_t *job_local;
  
  if (job->name != (char *)0x0) {
    free(job->name);
  }
  if ((job->cmdv).n != 0) {
    if ((job->cmdv).icd.dtor != (undefined1 *)0x0) {
      for (_ut_i_1 = 0; _ut_i_1 < (job->cmdv).i; _ut_i_1 = _ut_i_1 + 1) {
        if (_ut_i_1 < (job->cmdv).i) {
          local_40 = (job->cmdv).d + (job->cmdv).icd.sz * _ut_i_1;
        }
        else {
          local_40 = (char *)0x0;
        }
        (*(code *)(job->cmdv).icd.dtor)(local_40);
      }
    }
    free((job->cmdv).d);
  }
  (job->cmdv).n = 0;
  if ((job->envv).n != 0) {
    if ((job->envv).icd.dtor != (undefined1 *)0x0) {
      for (_ut_i_2 = 0; _ut_i_2 < (job->envv).i; _ut_i_2 = _ut_i_2 + 1) {
        if (_ut_i_2 < (job->envv).i) {
          local_50 = (job->envv).d + (job->envv).icd.sz * _ut_i_2;
        }
        else {
          local_50 = (char *)0x0;
        }
        (*(code *)(job->envv).icd.dtor)(local_50);
      }
    }
    free((job->envv).d);
  }
  (job->envv).n = 0;
  if ((job->depv).n != 0) {
    if ((job->depv).icd.dtor != (undefined1 *)0x0) {
      for (_ut_i_3 = 0; _ut_i_3 < (job->depv).i; _ut_i_3 = _ut_i_3 + 1) {
        if (_ut_i_3 < (job->depv).i) {
          local_60 = (job->depv).d + (job->depv).icd.sz * _ut_i_3;
        }
        else {
          local_60 = (char *)0x0;
        }
        (*(code *)(job->depv).icd.dtor)(local_60);
      }
    }
    free((job->depv).d);
  }
  (job->depv).n = 0;
  if ((job->rlim).n != 0) {
    if ((job->rlim).icd.dtor != (undefined1 *)0x0) {
      for (local_30 = 0; local_30 < (job->rlim).i; local_30 = local_30 + 1) {
        if (local_30 < (job->rlim).i) {
          local_70 = (job->rlim).d + (job->rlim).icd.sz * local_30;
        }
        else {
          local_70 = (char *)0x0;
        }
        (*(code *)(job->rlim).icd.dtor)(local_70);
      }
    }
    free((job->rlim).d);
  }
  (job->rlim).n = 0;
  if (job->dir != (char *)0x0) {
    free(job->dir);
  }
  if (job->out != (char *)0x0) {
    free(job->out);
  }
  if (job->err != (char *)0x0) {
    free(job->err);
  }
  if (job->in != (char *)0x0) {
    free(job->in);
  }
  return;
}

Assistant:

void job_fin(job_t *job) { 
  if (job->name) free(job->name);
  utarray_done(&job->cmdv); 
  utarray_done(&job->envv); 
  utarray_done(&job->depv); 
  utarray_done(&job->rlim); 
  if (job->dir) free(job->dir);
  if (job->out) free(job->out);
  if (job->err) free(job->err);
  if (job->in) free(job->in);
}